

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

AWeapon * __thiscall APlayerPawn::PickNewWeapon(APlayerPawn *this,PClassAmmo *ammotype)

{
  player_t *player;
  AWeapon *pAVar1;
  
  pAVar1 = BestWeapon(this,ammotype);
  if (pAVar1 != (AWeapon *)0x0) {
    player = (this->super_AActor).player;
    player->PendingWeapon = pAVar1;
    if (player->ReadyWeapon == (AWeapon *)0x0) {
      if (pAVar1 != (AWeapon *)AWeapon::RegistrationInfo.MyClass) {
        P_BringUpWeapon(player);
      }
    }
    else {
      P_DropWeapon(player);
    }
  }
  return pAVar1;
}

Assistant:

AWeapon *APlayerPawn::PickNewWeapon(PClassAmmo *ammotype)
{
	AWeapon *best = BestWeapon (ammotype);

	if (best != NULL)
	{
		player->PendingWeapon = best;
		if (player->ReadyWeapon != NULL)
		{
			P_DropWeapon(player);
		}
		else if (player->PendingWeapon != WP_NOCHANGE)
		{
			P_BringUpWeapon (player);
		}
	}
	return best;
}